

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser-test.c++
# Opt level: O0

void __thiscall capnp::anon_unknown_0::TestCase148::run(TestCase148 *this)

{
  ArrayPtr<const_kj::StringPtr> importPath;
  bool bVar1;
  ReaderFor<short> RVar2;
  ReaderFor<unsigned_int> RVar3;
  uint uVar4;
  ReaderFor<float> RVar5;
  ParsedSchema PVar6;
  ArrayPtr<const_char> AVar7;
  ArrayPtr<const_char> local_6d0;
  Reader local_6c0;
  ArrayPtr<const_char> local_678;
  bool local_661;
  undefined1 auStack_660 [7];
  bool _kj_shouldLog_6;
  Reader local_650;
  ArrayPtr<const_char> local_608;
  ArrayPtr<const_char> local_5f8;
  ParsedSchema local_5e8;
  Schema local_5d8;
  undefined1 local_5d0 [8];
  ReaderFor<capnp::DynamicStruct> genericConst;
  Reader local_588;
  ArrayPtr<const_char> local_540;
  bool local_529;
  undefined1 auStack_528 [7];
  bool _kj_shouldLog_5;
  Reader local_518;
  ArrayPtr<const_char> local_4d0;
  ArrayPtr<const_char> local_4c0;
  Reader local_4b0;
  ReaderFor<short> local_462;
  int local_460;
  bool local_459;
  undefined1 auStack_458 [7];
  bool _kj_shouldLog_4;
  Reader local_448;
  ArrayPtr<const_char> local_400;
  ParsedSchema local_3f0;
  Schema local_3e0;
  undefined1 local_3d8 [8];
  ReaderFor<capnp::DynamicStruct> structConst;
  ReaderFor<float> local_354;
  float local_350;
  bool local_349;
  undefined1 local_348 [7];
  bool _kj_shouldLog_3;
  Reader local_300;
  ReaderFor<float> local_2b4;
  double local_2b0;
  bool local_2a1;
  undefined1 local_2a0 [7];
  bool _kj_shouldLog_2;
  Reader local_258;
  ReaderFor<float> local_20c;
  double local_208;
  bool local_1f9;
  undefined1 local_1f8 [7];
  bool _kj_shouldLog_1;
  uint local_1b0;
  uint local_1ac;
  Fault local_1a8;
  Fault f;
  ParsedSchema local_190;
  Schema local_180;
  undefined1 local_178 [8];
  ReaderFor<capnp::DynamicList> list;
  ParsedSchema local_128;
  Schema local_118;
  ReaderFor<unsigned_int> local_10c [2];
  bool local_101;
  undefined1 auStack_100 [7];
  bool _kj_shouldLog;
  ParsedSchema local_f0;
  Schema local_e0;
  ArrayPtr<const_kj::StringPtr> local_d8;
  ArrayPtr<const_char> local_c8;
  ArrayPtr<const_char> local_b8;
  undefined1 local_a8 [8];
  ParsedSchema fileSchema;
  ArrayPtr<const_char> local_88 [2];
  undefined1 local_68 [8];
  SchemaParser parser;
  FakeFileReader reader;
  TestCase148 *this_local;
  
  FakeFileReader::FakeFileReader((FakeFileReader *)&parser.hadErrors);
  SchemaParser::SchemaParser((SchemaParser *)local_68);
  SchemaParser::setDiskFilesystem((SchemaParser *)local_68,(Filesystem *)&parser.hadErrors);
  kj::StringPtr::StringPtr((StringPtr *)local_88,"const.capnp");
  kj::StringPtr::StringPtr
            ((StringPtr *)&fileSchema.parser,
             "@0x8123456789abcdef;\nconst uint32Const :UInt32 = 1234;\nconst listConst :List(Float32) = [1.25, 2.5, 3e4];\nconst structConst :Foo = (bar = 123, baz = \"qux\");\nstruct Foo {\n  bar @0 :Int16;\n  baz @1 :Text;\n}\nconst genericConst :TestGeneric(Text) = (value = \"text\");\nstruct TestGeneric(T) {\n  value @0 :T;\n}\n"
            );
  FakeFileReader::add((FakeFileReader *)&parser.hadErrors,(StringPtr)local_88[0],
                      (StringPtr)stack0xffffffffffffff68);
  kj::StringPtr::StringPtr((StringPtr *)&local_b8,"const.capnp");
  kj::StringPtr::StringPtr((StringPtr *)&local_c8,"const.capnp");
  kj::ArrayPtr<const_kj::StringPtr>::ArrayPtr(&local_d8,(void *)0x0);
  importPath.size_ = local_d8.size_;
  importPath.ptr = local_d8.ptr;
  PVar6 = SchemaParser::parseDiskFile
                    ((SchemaParser *)local_68,(StringPtr)local_b8,(StringPtr)local_c8,importPath);
  fileSchema.super_Schema.raw = (RawBrandedSchema *)PVar6.parser;
  local_a8 = (undefined1  [8])PVar6.super_Schema.raw;
  kj::StringPtr::StringPtr((StringPtr *)auStack_100,"uint32Const");
  local_f0 = ParsedSchema::getNested((ParsedSchema *)local_a8,(StringPtr)_auStack_100);
  local_e0.raw = (RawBrandedSchema *)Schema::asConst(&local_f0.super_Schema);
  RVar3 = ConstSchema::as<unsigned_int>((ConstSchema *)&local_e0);
  if (RVar3 != 0x4d2) {
    local_101 = kj::_::Debug::shouldLog(ERROR);
    while (local_101 != false) {
      local_10c[1] = 0x4d2;
      kj::StringPtr::StringPtr((StringPtr *)&list.reader.nestingLimit,"uint32Const");
      PVar6 = ParsedSchema::getNested((ParsedSchema *)local_a8,(StringPtr)stack0xfffffffffffffec8);
      local_128 = PVar6;
      local_118.raw = (RawBrandedSchema *)Schema::asConst(&local_128.super_Schema);
      local_10c[0] = ConstSchema::as<unsigned_int>((ConstSchema *)&local_118);
      kj::_::Debug::log<char_const(&)[90],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0xae,ERROR,
                 "\"failed: expected \" \"(1234) == (fileSchema.getNested(\\\"uint32Const\\\").asConst().as<uint32_t>())\", 1234, fileSchema.getNested(\"uint32Const\").asConst().as<uint32_t>()"
                 ,(char (*) [90])
                  "failed: expected (1234) == (fileSchema.getNested(\"uint32Const\").asConst().as<uint32_t>())"
                 ,(int *)(local_10c + 1),local_10c);
      local_101 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&f,"listConst");
  local_190 = ParsedSchema::getNested((ParsedSchema *)local_a8,(StringPtr)_f);
  local_180.raw = (RawBrandedSchema *)Schema::asConst(&local_190.super_Schema);
  ConstSchema::as<capnp::DynamicList>
            ((ReaderFor<capnp::DynamicList> *)local_178,(ConstSchema *)&local_180);
  uVar4 = DynamicList::Reader::size((Reader *)local_178);
  if (uVar4 != 3) {
    local_1ac = 3;
    local_1b0 = DynamicList::Reader::size((Reader *)local_178);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_1a8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
               ,0xb1,FAILED,"(3u) == (list.size())","3u, list.size()",&local_1ac,&local_1b0);
    kj::_::Debug::Fault::fatal(&local_1a8);
  }
  DynamicList::Reader::operator[]((Reader *)local_1f8,(Reader *)local_178,0);
  RVar5 = DynamicValue::Reader::as<float>((Reader *)local_1f8);
  DynamicValue::Reader::~Reader((Reader *)local_1f8);
  if (RVar5 != 1.25) {
    local_1f9 = kj::_::Debug::shouldLog(ERROR);
    while (local_1f9 != false) {
      local_208 = 1.25;
      DynamicList::Reader::operator[](&local_258,(Reader *)local_178,0);
      local_20c = DynamicValue::Reader::as<float>(&local_258);
      kj::_::Debug::log<char_const(&)[49],double,float>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0xb2,ERROR,
                 "\"failed: expected \" \"(1.25) == (list[0].as<float>())\", 1.25, list[0].as<float>()"
                 ,(char (*) [49])"failed: expected (1.25) == (list[0].as<float>())",&local_208,
                 &local_20c);
      DynamicValue::Reader::~Reader(&local_258);
      local_1f9 = false;
    }
  }
  DynamicList::Reader::operator[]((Reader *)local_2a0,(Reader *)local_178,1);
  RVar5 = DynamicValue::Reader::as<float>((Reader *)local_2a0);
  DynamicValue::Reader::~Reader((Reader *)local_2a0);
  if (RVar5 != 2.5) {
    local_2a1 = kj::_::Debug::shouldLog(ERROR);
    while (local_2a1 != false) {
      local_2b0 = 2.5;
      DynamicList::Reader::operator[](&local_300,(Reader *)local_178,1);
      local_2b4 = DynamicValue::Reader::as<float>(&local_300);
      kj::_::Debug::log<char_const(&)[48],double,float>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0xb3,ERROR,
                 "\"failed: expected \" \"(2.5) == (list[1].as<float>())\", 2.5, list[1].as<float>()"
                 ,(char (*) [48])"failed: expected (2.5) == (list[1].as<float>())",&local_2b0,
                 &local_2b4);
      DynamicValue::Reader::~Reader(&local_300);
      local_2a1 = false;
    }
  }
  DynamicList::Reader::operator[]((Reader *)local_348,(Reader *)local_178,2);
  RVar5 = DynamicValue::Reader::as<float>((Reader *)local_348);
  DynamicValue::Reader::~Reader((Reader *)local_348);
  if (RVar5 != 30000.0) {
    local_349 = kj::_::Debug::shouldLog(ERROR);
    while (local_349 != false) {
      local_350 = 30000.0;
      DynamicList::Reader::operator[]
                ((Reader *)&structConst.reader.nestingLimit,(Reader *)local_178,2);
      local_354 = DynamicValue::Reader::as<float>((Reader *)&structConst.reader.nestingLimit);
      kj::_::Debug::log<char_const(&)[49],float,float>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0xb4,ERROR,
                 "\"failed: expected \" \"(3e4f) == (list[2].as<float>())\", 3e4f, list[2].as<float>()"
                 ,(char (*) [49])"failed: expected (3e4f) == (list[2].as<float>())",&local_350,
                 &local_354);
      DynamicValue::Reader::~Reader((Reader *)&structConst.reader.nestingLimit);
      local_349 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&local_400,"structConst");
  local_3f0 = ParsedSchema::getNested((ParsedSchema *)local_a8,(StringPtr)local_400);
  local_3e0.raw = (RawBrandedSchema *)Schema::asConst(&local_3f0.super_Schema);
  ConstSchema::as<capnp::DynamicStruct>
            ((ReaderFor<capnp::DynamicStruct> *)local_3d8,(ConstSchema *)&local_3e0);
  kj::StringPtr::StringPtr((StringPtr *)auStack_458,"bar");
  DynamicStruct::Reader::get(&local_448,(Reader *)local_3d8,(StringPtr)_auStack_458);
  RVar2 = DynamicValue::Reader::as<short>(&local_448);
  DynamicValue::Reader::~Reader(&local_448);
  if (RVar2 != 0x7b) {
    local_459 = kj::_::Debug::shouldLog(ERROR);
    while (local_459 != false) {
      local_460 = 0x7b;
      kj::StringPtr::StringPtr((StringPtr *)&local_4c0,"bar");
      DynamicStruct::Reader::get(&local_4b0,(Reader *)local_3d8,(StringPtr)local_4c0);
      local_462 = DynamicValue::Reader::as<short>(&local_4b0);
      kj::_::Debug::log<char_const(&)[65],int,short>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0xb7,ERROR,
                 "\"failed: expected \" \"(123) == (structConst.get(\\\"bar\\\").as<int16_t>())\", 123, structConst.get(\"bar\").as<int16_t>()"
                 ,(char (*) [65])
                  "failed: expected (123) == (structConst.get(\"bar\").as<int16_t>())",&local_460,
                 &local_462);
      DynamicValue::Reader::~Reader(&local_4b0);
      local_459 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_528,"baz");
  DynamicStruct::Reader::get(&local_518,(Reader *)local_3d8,(StringPtr)_auStack_528);
  local_4d0 = (ArrayPtr<const_char>)DynamicValue::Reader::as<capnp::Text>(&local_518);
  bVar1 = kj::operator==("qux",(StringPtr *)&local_4d0);
  DynamicValue::Reader::~Reader(&local_518);
  if (!bVar1) {
    local_529 = kj::_::Debug::shouldLog(ERROR);
    while (local_529 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&genericConst.reader.nestingLimit,"baz");
      DynamicStruct::Reader::get(&local_588,(Reader *)local_3d8,(StringPtr)stack0xfffffffffffffa68);
      AVar7 = (ArrayPtr<const_char>)DynamicValue::Reader::as<capnp::Text>(&local_588);
      local_540 = AVar7;
      kj::_::Debug::log<char_const(&)[64],char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0xb8,ERROR,
                 "\"failed: expected \" \"(\\\"qux\\\") == (structConst.get(\\\"baz\\\").as<Text>())\", \"qux\", structConst.get(\"baz\").as<Text>()"
                 ,(char (*) [64])
                  "failed: expected (\"qux\") == (structConst.get(\"baz\").as<Text>())",
                 (char (*) [4])0xa54382,(Reader *)&local_540);
      DynamicValue::Reader::~Reader(&local_588);
      local_529 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&local_5f8,"genericConst");
  local_5e8 = ParsedSchema::getNested((ParsedSchema *)local_a8,(StringPtr)local_5f8);
  local_5d8.raw = (RawBrandedSchema *)Schema::asConst(&local_5e8.super_Schema);
  ConstSchema::as<capnp::DynamicStruct>
            ((ReaderFor<capnp::DynamicStruct> *)local_5d0,(ConstSchema *)&local_5d8);
  kj::StringPtr::StringPtr((StringPtr *)auStack_660,"value");
  DynamicStruct::Reader::get(&local_650,(Reader *)local_5d0,(StringPtr)_auStack_660);
  local_608 = (ArrayPtr<const_char>)DynamicValue::Reader::as<capnp::Text>(&local_650);
  bVar1 = kj::operator==("text",(StringPtr *)&local_608);
  DynamicValue::Reader::~Reader(&local_650);
  if (!bVar1) {
    local_661 = kj::_::Debug::shouldLog(ERROR);
    while (local_661 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_6d0,"value");
      DynamicStruct::Reader::get(&local_6c0,(Reader *)local_5d0,(StringPtr)local_6d0);
      AVar7 = (ArrayPtr<const_char>)DynamicValue::Reader::as<capnp::Text>(&local_6c0);
      local_678 = AVar7;
      kj::_::Debug::log<char_const(&)[68],char_const(&)[5],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                 ,0xbb,ERROR,
                 "\"failed: expected \" \"(\\\"text\\\") == (genericConst.get(\\\"value\\\").as<Text>())\", \"text\", genericConst.get(\"value\").as<Text>()"
                 ,(char (*) [68])
                  "failed: expected (\"text\") == (genericConst.get(\"value\").as<Text>())",
                 (char (*) [5])0xa463ac,(Reader *)&local_678);
      DynamicValue::Reader::~Reader(&local_6c0);
      local_661 = false;
    }
  }
  SchemaParser::~SchemaParser((SchemaParser *)local_68);
  FakeFileReader::~FakeFileReader((FakeFileReader *)&parser.hadErrors);
  return;
}

Assistant:

TEST(SchemaParser, Constants) {
  // This is actually a test of the full dynamic API stack for constants, because the schemas for
  // constants are not actually accessible from the generated code API, so the only way to ever
  // get a ConstSchema is by parsing it.

  FakeFileReader reader;
  SchemaParser parser;
  parser.setDiskFilesystem(reader);

  reader.add("const.capnp",
      "@0x8123456789abcdef;\n"
      "const uint32Const :UInt32 = 1234;\n"
      "const listConst :List(Float32) = [1.25, 2.5, 3e4];\n"
      "const structConst :Foo = (bar = 123, baz = \"qux\");\n"
      "struct Foo {\n"
      "  bar @0 :Int16;\n"
      "  baz @1 :Text;\n"
      "}\n"
      "const genericConst :TestGeneric(Text) = (value = \"text\");\n"
      "struct TestGeneric(T) {\n"
      "  value @0 :T;\n"
      "}\n");

  ParsedSchema fileSchema = parser.parseDiskFile(
      "const.capnp", "const.capnp", nullptr);

  EXPECT_EQ(1234, fileSchema.getNested("uint32Const").asConst().as<uint32_t>());

  auto list = fileSchema.getNested("listConst").asConst().as<DynamicList>();
  ASSERT_EQ(3u, list.size());
  EXPECT_EQ(1.25, list[0].as<float>());
  EXPECT_EQ(2.5, list[1].as<float>());
  EXPECT_EQ(3e4f, list[2].as<float>());

  auto structConst = fileSchema.getNested("structConst").asConst().as<DynamicStruct>();
  EXPECT_EQ(123, structConst.get("bar").as<int16_t>());
  EXPECT_EQ("qux", structConst.get("baz").as<Text>());

  auto genericConst = fileSchema.getNested("genericConst").asConst().as<DynamicStruct>();
  EXPECT_EQ("text", genericConst.get("value").as<Text>());
}